

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_timeout.cpp
# Opt level: O0

void __thiscall tst_qpromise_timeout::timeout(tst_qpromise_timeout *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  anon_class_16_2_30a9d772 handler;
  bool local_c3;
  bool local_c2;
  bool local_c1 [5];
  int local_bc;
  undefined1 *local_b8;
  QPromiseBase<int> local_b0;
  QPromiseBase<int> local_a0;
  QElapsedTimer *local_90;
  qint64 *local_88;
  QPromiseTimeoutException local_70;
  anon_class_1_0_00000001 local_61;
  QPromise<int> local_60;
  QPromiseBase<int> local_50;
  undefined1 local_40 [8];
  QPromise<int> p;
  undefined1 auStack_28 [7];
  bool failed;
  qint64 elapsed;
  QElapsedTimer timer;
  tst_qpromise_timeout *this_local;
  
  timer.t2 = (qint64)this;
  QElapsedTimer::QElapsedTimer((QElapsedTimer *)&elapsed);
  _auStack_28 = -1;
  p.super_QPromiseBase<int>.m_d.d._7_1_ = 0;
  QElapsedTimer::start();
  QtPromise::QPromise<int>::QPromise<tst_qpromise_timeout::timeout()::__0>(&local_60,&local_61);
  local_70 = (QPromiseTimeoutException)0x0;
  QtPromise::QPromiseTimeoutException::QPromiseTimeoutException(&local_70);
  QtPromise::QPromiseBase<int>::timeout<QtPromise::QPromiseTimeoutException>
            (&local_50,(int)&local_60,(QPromiseTimeoutException *)0x7d0);
  local_90 = (QElapsedTimer *)auStack_28;
  local_88 = &elapsed;
  handler.timer = local_90;
  handler.elapsed = (qint64 *)&local_50;
  QtPromise::QPromiseBase<int>::finally<tst_qpromise_timeout::timeout()::__1>
            ((QPromiseBase<int> *)local_40,handler);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_50);
  QtPromise::QPromiseTimeoutException::~QPromiseTimeoutException(&local_70);
  QtPromise::QPromise<int>::~QPromise(&local_60);
  local_b8 = (undefined1 *)((long)&p.super_QPromiseBase<int>.m_d.d + 7);
  QtPromise::QPromiseBase<int>::fail<tst_qpromise_timeout::timeout()::__2>
            (&local_b0,(anon_class_8_1_54ba857b *)local_40);
  QtPromise::QPromiseBase<int>::wait(&local_a0,&local_b0);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_a0);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_b0);
  local_bc = -1;
  iVar3 = waitForValue<int>((QPromise<int> *)local_40,&local_bc);
  bVar1 = QTest::qCompare(iVar3,-1,"waitForValue(p, -1)","-1",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                          ,0x61);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    local_c1[0] = QtPromise::QPromiseBase<int>::isRejected((QPromiseBase<int> *)local_40);
    local_c2 = true;
    bVar2 = QTest::qCompare<bool,bool>
                      (local_c1,&local_c2,"p.isRejected()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                       ,0x62);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_c3 = true;
      bVar2 = QTest::qCompare<bool,bool>
                        ((bool *)((long)&p.super_QPromiseBase<int>.m_d.d + 7),&local_c3,"failed",
                         "true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                         ,99);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        bVar1 = QTest::qVerify(0x757 < _auStack_28,"elapsed >= static_cast<qint64>(2000 * 0.94)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                               ,0x68);
        if ((bVar1 & 1) == 0) {
          local_c1[1] = true;
          local_c1[2] = false;
          local_c1[3] = false;
          local_c1[4] = false;
        }
        else {
          bVar1 = QTest::qVerify(_auStack_28 < 0x849,"elapsed <= static_cast<qint64>(2000 * 1.06)",
                                 "",
                                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                                 ,0x69);
          if ((bVar1 & 1) == 0) {
            local_c1[1] = true;
            local_c1[2] = false;
            local_c1[3] = false;
            local_c1[4] = false;
          }
          else {
            local_c1[1] = false;
            local_c1[2] = false;
            local_c1[3] = false;
            local_c1[4] = false;
          }
        }
      }
      else {
        local_c1[1] = true;
        local_c1[2] = false;
        local_c1[3] = false;
        local_c1[4] = false;
      }
    }
    else {
      local_c1[1] = true;
      local_c1[2] = false;
      local_c1[3] = false;
      local_c1[4] = false;
    }
  }
  else {
    local_c1[1] = true;
    local_c1[2] = false;
    local_c1[3] = false;
    local_c1[4] = false;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_40);
  return;
}

Assistant:

void tst_qpromise_timeout::timeout()
{
    QElapsedTimer timer;
    qint64 elapsed = -1;
    bool failed = false;

    timer.start();

    auto p = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>& resolve) {
                 QTimer::singleShot(4000, [=]() {
                     resolve(42);
                 });
             }}.timeout(2000)
                 .finally([&]() {
                     elapsed = timer.elapsed();
                 });

    p.fail([&](const QtPromise::QPromiseTimeoutException&) {
         failed = true;
         return -1;
     }).wait();

    QCOMPARE(waitForValue(p, -1), -1);
    QCOMPARE(p.isRejected(), true);
    QCOMPARE(failed, true);

    // Qt::CoarseTimer (default) Coarse timers try to
    // keep accuracy within 5% of the desired interval.
    // Require accuracy within 6% for passing the test.
    QVERIFY(elapsed >= static_cast<qint64>(2000 * 0.94));
    QVERIFY(elapsed <= static_cast<qint64>(2000 * 1.06));
}